

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::basisu_transcoder_init(void)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  ulong uVar18;
  uint32_t i;
  long lVar19;
  undefined4 *puVar20;
  undefined1 *puVar21;
  ulong uVar22;
  byte bVar23;
  uint32_t base_color;
  int iVar24;
  long lVar25;
  int hi_1;
  uint32_t best_mapping;
  int iVar26;
  uint uVar27;
  int iVar28;
  int lo;
  int *piVar29;
  int lo_1;
  long lVar30;
  uint32_t inten_table;
  int iVar31;
  long lVar32;
  uint32_t l_1;
  int iVar33;
  uint *puVar34;
  int hi;
  int iVar35;
  int iVar36;
  long lVar37;
  uint32_t range_index;
  long lVar38;
  uint uVar39;
  uint32_t mapping_index;
  ulong uVar40;
  uint32_t k;
  uint uVar41;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar42 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  int iVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar73;
  uint uVar74;
  uint uVar75;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar88;
  int iVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar90;
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv [4];
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1 [4];
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  byte abStack_a0 [4];
  byte abStack_9c [4];
  byte local_98 [32];
  byte local_78 [72];
  
  if (g_transcoder_initialized == '\0') {
    uastc_init();
    lVar19 = 0x27fbd2;
    lVar25 = 0;
    do {
      lVar32 = 0;
      lVar30 = lVar19;
      do {
        lVar38 = 0;
        lVar37 = lVar30;
        do {
          uVar27 = 0xffffffff;
          uVar40 = 0;
          uVar22 = 0;
          do {
            uVar1 = *(ushort *)(lVar37 + uVar40 * 4);
            if (uVar1 < uVar27) {
              uVar22 = uVar40 & 0xffffffff;
            }
            if (uVar1 <= uVar27) {
              uVar27 = (uint)uVar1;
            }
            uVar40 = uVar40 + 1;
          } while (uVar40 != 10);
          (&g_etc1_to_astc_best_grayscale_mapping)[lVar38 + lVar32 * 6 + lVar25 * 0x30] =
               (char)uVar22;
          lVar38 = lVar38 + 1;
          lVar37 = lVar37 + 0x28;
        } while (lVar38 != 6);
        lVar32 = lVar32 + 1;
        lVar30 = lVar30 + 0x1e00;
      } while (lVar32 != 8);
      lVar25 = lVar25 + 1;
      lVar19 = lVar19 + 0xf0;
    } while (lVar25 != 0x20);
    lVar19 = 0x28ebd2;
    lVar25 = 0;
    do {
      lVar32 = 0;
      lVar30 = lVar19;
      do {
        lVar38 = 0;
        lVar37 = lVar30;
        do {
          uVar27 = 0xffffffff;
          uVar40 = 0;
          uVar22 = 0;
          do {
            uVar1 = *(ushort *)(lVar37 + uVar40 * 4);
            if (uVar1 < uVar27) {
              uVar22 = uVar40 & 0xffffffff;
            }
            if (uVar1 <= uVar27) {
              uVar27 = (uint)uVar1;
            }
            uVar40 = uVar40 + 1;
          } while (uVar40 != 10);
          (&g_etc1_to_astc_best_grayscale_mapping_0_255)[lVar38 + lVar32 * 6 + lVar25 * 0x30] =
               (char)uVar22;
          lVar38 = lVar38 + 1;
          lVar37 = lVar37 + 0x28;
        } while (lVar38 != 6);
        lVar32 = lVar32 + 1;
        lVar30 = lVar30 + 0x1e00;
      } while (lVar32 != 8);
      lVar25 = lVar25 + 1;
      lVar19 = lVar19 + 0xf0;
    } while (lVar25 != 0x20);
    lVar19 = 0;
    do {
      *(int *)(g_etc1_to_astc_selector_range_index +
              (ulong)(uint)(&DAT_0029dbd4)[lVar19 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar19 * 2] * 0x10) = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    puVar20 = &g_ise_to_unquant;
    lVar19 = 0;
    auVar42 = pmovsxbq(extraout_XMM0,0x302);
    auVar44 = pmovsxbq(in_XMM1,0x100);
    auVar46 = pmovsxbd(in_XMM2,0x3020100);
    auVar48 = pmovsxbq(in_XMM3,0x101);
    auVar51 = pmovsxwd(in_XMM5,0x1ff01ff01ff01ff);
    auVar53 = pmovzxbd(in_XMM6,0x80808080);
    auVar55 = pmovsxbq(in_XMM7,0x404);
    auVar57 = pmovsxbd(in_XMM8,0x4040404);
    do {
      iVar24 = (int)lVar19 * 0x16;
      lVar25 = 0;
      auVar83 = auVar44;
      auVar87 = auVar42;
      auVar61 = auVar46;
      do {
        auVar85._0_8_ = -(ulong)(SUB168(auVar83 & auVar48,0) == 0);
        auVar85._8_8_ = -(ulong)(SUB168(auVar83 & auVar48,8) == 0);
        auVar86._0_8_ = -(ulong)(SUB168(auVar87 & auVar48,0) == 0);
        auVar86._8_8_ = -(ulong)(SUB168(auVar87 & auVar48,8) == 0);
        auVar86 = packssdw(auVar85,auVar86);
        uVar27 = auVar61._4_4_;
        uVar41 = auVar61._8_4_;
        uVar39 = auVar61._12_4_;
        auVar81._0_4_ = (auVar61._0_4_ >> 1) * 0x41 + iVar24;
        auVar81._4_4_ = (uVar27 >> 1) * 0x41 + iVar24;
        auVar81._8_4_ = (uVar41 >> 1) * 0x41 + iVar24;
        auVar81._12_4_ = (uVar39 >> 1) * 0x41 + iVar24;
        auVar81 = auVar81 ^ ~auVar86 & auVar51;
        auVar86 = ~auVar86 & auVar51 & auVar53;
        auVar82._0_4_ = auVar81._0_4_ >> 2;
        auVar82._4_4_ = auVar81._4_4_ >> 2;
        auVar82._8_4_ = auVar81._8_4_ >> 2;
        auVar82._12_4_ = auVar81._12_4_ >> 2;
        auVar82 = auVar82 | auVar86;
        *(undefined1 (*) [16])(puVar20 + lVar25) = auVar82;
        lVar25 = lVar25 + 4;
        lVar30 = auVar83._8_8_;
        auVar83._0_8_ = auVar83._0_8_ + auVar55._0_8_;
        auVar83._8_8_ = lVar30 + auVar55._8_8_;
        lVar30 = auVar87._8_8_;
        auVar87._0_8_ = auVar87._0_8_ + auVar55._0_8_;
        auVar87._8_8_ = lVar30 + auVar55._8_8_;
        auVar61._0_4_ = auVar61._0_4_ + auVar57._0_4_;
        auVar61._4_4_ = uVar27 + auVar57._4_4_;
        auVar61._8_4_ = uVar41 + auVar57._8_4_;
        auVar61._12_4_ = uVar39 + auVar57._12_4_;
      } while (lVar25 != 0x10);
      lVar19 = lVar19 + 1;
      puVar20 = puVar20 + 0x10;
    } while (lVar19 != 3);
    lVar19 = 0;
    do {
      iVar24 = 0x7fffffff;
      lVar25 = 0;
      do {
        iVar31 = ((&g_ise_to_unquant)[lVar25] << 8 | (&g_ise_to_unquant)[lVar25]) * 0x2b;
        puVar34 = &g_ise_to_unquant;
        lVar30 = 0;
        do {
          iVar35 = (*puVar34 << 8 | *puVar34) * 0x15;
          iVar26 = iVar31 + 0x20 + iVar35;
          iVar35 = iVar31 + 0x5f + iVar35;
          if (-1 < iVar26) {
            iVar35 = iVar26;
          }
          iVar26 = (iVar35 >> 0xe) - (int)lVar19;
          iVar35 = -iVar26;
          if (0 < iVar26) {
            iVar35 = iVar26;
          }
          if (iVar35 < iVar24) {
            (&DAT_003648e1)[lVar19 * 2] = (char)lVar30;
            (&g_astc_single_color_encoding_1)[lVar19 * 2] = (char)lVar25;
            iVar24 = iVar35;
          }
          lVar30 = lVar30 + 1;
          puVar34 = puVar34 + 1;
        } while (lVar30 != 0x30);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x30);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    lVar19 = 0;
    do {
      iVar24 = 0x7fffffff;
      piVar29 = &g_ise_to_unquant;
      lVar25 = 0;
      do {
        iVar35 = *piVar29 - (int)lVar19;
        iVar31 = -iVar35;
        if (0 < iVar35) {
          iVar31 = iVar35;
        }
        if (iVar31 < iVar24) {
          (&g_astc_single_color_encoding_0)[lVar19] = (char)lVar25;
          iVar24 = iVar31;
        }
        lVar25 = lVar25 + 1;
        piVar29 = piVar29 + 1;
      } while (lVar25 != 0x30);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    auVar51 = pmovsxbd(auVar42,0xf0e0d0c);
    auVar53 = pmovsxbd(auVar44,0xb0a0908);
    auVar55 = pmovsxbd(auVar46,0x7060504);
    auVar57 = pmovsxbd(auVar48,0x3020100);
    lVar19 = 0;
    auVar83 = pmovzxbd(auVar82,0xffffffff);
    auVar87 = pmovsxbd(auVar86,0x10101010);
    auVar42 = auVar57;
    auVar44 = auVar55;
    auVar46 = auVar53;
    auVar48 = auVar51;
    do {
      uVar27 = auVar57._4_4_;
      uVar41 = auVar57._8_4_;
      uVar39 = auVar57._12_4_;
      uVar63 = auVar55._4_4_;
      uVar64 = auVar55._8_4_;
      uVar65 = auVar55._12_4_;
      uVar68 = auVar53._4_4_;
      uVar69 = auVar53._8_4_;
      uVar71 = auVar53._12_4_;
      uVar73 = auVar51._4_4_;
      uVar74 = auVar51._8_4_;
      uVar75 = auVar51._12_4_;
      iVar78 = auVar42._4_4_;
      iVar79 = auVar42._8_4_;
      iVar80 = auVar42._12_4_;
      auVar76._0_4_ = auVar42._0_4_ * 8 + (auVar57._0_4_ >> 2);
      auVar76._4_4_ = iVar78 * 8 + (uVar27 >> 2);
      auVar76._8_4_ = iVar79 * 8 + (uVar41 >> 2);
      auVar76._12_4_ = iVar80 * 8 + (uVar39 >> 2);
      iVar24 = auVar44._4_4_;
      iVar31 = auVar44._8_4_;
      iVar35 = auVar44._12_4_;
      auVar58._0_4_ = auVar44._0_4_ * 8 + (auVar55._0_4_ >> 2);
      auVar58._4_4_ = iVar24 * 8 + (uVar63 >> 2);
      auVar58._8_4_ = iVar31 * 8 + (uVar64 >> 2);
      auVar58._12_4_ = iVar35 * 8 + (uVar65 >> 2);
      iVar26 = auVar46._4_4_;
      iVar36 = auVar46._8_4_;
      iVar33 = auVar46._12_4_;
      auVar60._0_4_ = auVar46._0_4_ * 8 + (auVar53._0_4_ >> 2);
      auVar60._4_4_ = iVar26 * 8 + (uVar68 >> 2);
      auVar60._8_4_ = iVar36 * 8 + (uVar69 >> 2);
      auVar60._12_4_ = iVar33 * 8 + (uVar71 >> 2);
      iVar28 = auVar48._4_4_;
      iVar70 = auVar48._8_4_;
      iVar72 = auVar48._12_4_;
      auVar66._0_4_ = auVar48._0_4_ * 8 + (auVar51._0_4_ >> 2);
      auVar66._4_4_ = iVar28 * 8 + (uVar73 >> 2);
      auVar66._8_4_ = iVar70 * 8 + (uVar74 >> 2);
      auVar66._12_4_ = iVar72 * 8 + (uVar75 >> 2);
      auVar86 = packusdw(auVar76 & auVar83,auVar58 & auVar83);
      auVar61 = packusdw(auVar60 & auVar83,auVar66 & auVar83);
      sVar2 = auVar86._0_2_;
      sVar3 = auVar86._2_2_;
      sVar4 = auVar86._4_2_;
      sVar5 = auVar86._6_2_;
      sVar6 = auVar86._8_2_;
      sVar7 = auVar86._10_2_;
      sVar8 = auVar86._12_2_;
      sVar9 = auVar86._14_2_;
      sVar10 = auVar61._0_2_;
      sVar11 = auVar61._2_2_;
      sVar12 = auVar61._4_2_;
      sVar13 = auVar61._6_2_;
      sVar14 = auVar61._8_2_;
      sVar15 = auVar61._10_2_;
      sVar16 = auVar61._12_2_;
      sVar17 = auVar61._14_2_;
      local_98[lVar19] = (0 < sVar2) * (sVar2 < 0x100) * auVar86[0] - (0xff < sVar2);
      local_98[lVar19 + 1] = (0 < sVar3) * (sVar3 < 0x100) * auVar86[2] - (0xff < sVar3);
      local_98[lVar19 + 2] = (0 < sVar4) * (sVar4 < 0x100) * auVar86[4] - (0xff < sVar4);
      local_98[lVar19 + 3] = (0 < sVar5) * (sVar5 < 0x100) * auVar86[6] - (0xff < sVar5);
      local_98[lVar19 + 4] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[8] - (0xff < sVar6);
      local_98[lVar19 + 5] = (0 < sVar7) * (sVar7 < 0x100) * auVar86[10] - (0xff < sVar7);
      local_98[lVar19 + 6] = (0 < sVar8) * (sVar8 < 0x100) * auVar86[0xc] - (0xff < sVar8);
      local_98[lVar19 + 7] = (0 < sVar9) * (sVar9 < 0x100) * auVar86[0xe] - (0xff < sVar9);
      local_98[lVar19 + 8] = (0 < sVar10) * (sVar10 < 0x100) * auVar61[0] - (0xff < sVar10);
      local_98[lVar19 + 9] = (0 < sVar11) * (sVar11 < 0x100) * auVar61[2] - (0xff < sVar11);
      local_98[lVar19 + 10] = (0 < sVar12) * (sVar12 < 0x100) * auVar61[4] - (0xff < sVar12);
      local_98[lVar19 + 0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar61[6] - (0xff < sVar13);
      local_98[lVar19 + 0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar61[8] - (0xff < sVar14);
      local_98[lVar19 + 0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar61[10] - (0xff < sVar15);
      local_98[lVar19 + 0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar61[0xc] - (0xff < sVar16);
      local_98[lVar19 + 0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar61[0xe] - (0xff < sVar17);
      lVar19 = lVar19 + 0x10;
      iVar84 = auVar87._0_4_;
      auVar57._0_4_ = auVar57._0_4_ + iVar84;
      iVar88 = auVar87._4_4_;
      auVar57._4_4_ = uVar27 + iVar88;
      iVar89 = auVar87._8_4_;
      auVar57._8_4_ = uVar41 + iVar89;
      iVar90 = auVar87._12_4_;
      auVar57._12_4_ = uVar39 + iVar90;
      auVar55._0_4_ = auVar55._0_4_ + iVar84;
      auVar55._4_4_ = uVar63 + iVar88;
      auVar55._8_4_ = uVar64 + iVar89;
      auVar55._12_4_ = uVar65 + iVar90;
      auVar53._0_4_ = auVar53._0_4_ + iVar84;
      auVar53._4_4_ = uVar68 + iVar88;
      auVar53._8_4_ = uVar69 + iVar89;
      auVar53._12_4_ = uVar71 + iVar90;
      auVar51._0_4_ = auVar51._0_4_ + iVar84;
      auVar51._4_4_ = uVar73 + iVar88;
      auVar51._8_4_ = uVar74 + iVar89;
      auVar51._12_4_ = uVar75 + iVar90;
      auVar42._0_4_ = auVar42._0_4_ + iVar84;
      auVar42._4_4_ = iVar78 + iVar88;
      auVar42._8_4_ = iVar79 + iVar89;
      auVar42._12_4_ = iVar80 + iVar90;
      auVar44._0_4_ = auVar44._0_4_ + iVar84;
      auVar44._4_4_ = iVar24 + iVar88;
      auVar44._8_4_ = iVar31 + iVar89;
      auVar44._12_4_ = iVar35 + iVar90;
      auVar46._0_4_ = auVar46._0_4_ + iVar84;
      auVar46._4_4_ = iVar26 + iVar88;
      auVar46._8_4_ = iVar36 + iVar89;
      auVar46._12_4_ = iVar33 + iVar90;
      auVar48._0_4_ = auVar48._0_4_ + iVar84;
      auVar48._4_4_ = iVar28 + iVar88;
      auVar48._8_4_ = iVar70 + iVar89;
      auVar48._12_4_ = iVar72 + iVar90;
    } while (lVar19 != 0x20);
    prepare_bc1_single_color_table((bc1_match_entry *)&g_bc1_match5_equals_1,local_98,0x20,0x20,1);
    lVar19 = 0;
    do {
      iVar24 = 0x100;
      lVar25 = 0;
      do {
        iVar35 = (uint)local_98[lVar25] - (int)lVar19;
        iVar31 = -iVar35;
        if (0 < iVar35) {
          iVar31 = iVar35;
        }
        if (iVar31 < iVar24) {
          (&g_bc1_match5_equals_0)[lVar19 * 2] = (char)lVar25;
          (&DAT_0035eb21)[lVar19 * 2] = 0;
          iVar24 = iVar31;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x20);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    auVar43 = pmovsxbd(extraout_XMM0_00,0xf0e0d0c);
    auVar45 = pmovsxbd(auVar53,0xb0a0908);
    auVar47 = pmovsxbd(auVar55,0x7060504);
    auVar49 = pmovsxbd(auVar57,0x3020100);
    lVar19 = 0;
    auVar42 = pmovzxbd(auVar83,0xffffffff);
    auVar44 = pmovsxbd(auVar87,0x10101010);
    auVar50 = auVar49;
    auVar52 = auVar47;
    auVar54 = auVar45;
    auVar56 = auVar43;
    do {
      uVar27 = auVar49._4_4_;
      uVar41 = auVar49._8_4_;
      uVar39 = auVar49._12_4_;
      uVar63 = auVar47._4_4_;
      uVar64 = auVar47._8_4_;
      uVar65 = auVar47._12_4_;
      uVar68 = auVar45._4_4_;
      uVar69 = auVar45._8_4_;
      uVar71 = auVar45._12_4_;
      uVar73 = auVar43._4_4_;
      uVar74 = auVar43._8_4_;
      uVar75 = auVar43._12_4_;
      iVar78 = auVar50._4_4_;
      iVar79 = auVar50._8_4_;
      iVar80 = auVar50._12_4_;
      auVar77._0_4_ = auVar50._0_4_ * 4 + (auVar49._0_4_ >> 4);
      auVar77._4_4_ = iVar78 * 4 + (uVar27 >> 4);
      auVar77._8_4_ = iVar79 * 4 + (uVar41 >> 4);
      auVar77._12_4_ = iVar80 * 4 + (uVar39 >> 4);
      iVar24 = auVar52._4_4_;
      iVar31 = auVar52._8_4_;
      iVar35 = auVar52._12_4_;
      auVar59._0_4_ = auVar52._0_4_ * 4 + (auVar47._0_4_ >> 4);
      auVar59._4_4_ = iVar24 * 4 + (uVar63 >> 4);
      auVar59._8_4_ = iVar31 * 4 + (uVar64 >> 4);
      auVar59._12_4_ = iVar35 * 4 + (uVar65 >> 4);
      iVar26 = auVar54._4_4_;
      iVar36 = auVar54._8_4_;
      iVar33 = auVar54._12_4_;
      auVar62._0_4_ = auVar54._0_4_ * 4 + (auVar45._0_4_ >> 4);
      auVar62._4_4_ = iVar26 * 4 + (uVar68 >> 4);
      auVar62._8_4_ = iVar36 * 4 + (uVar69 >> 4);
      auVar62._12_4_ = iVar33 * 4 + (uVar71 >> 4);
      iVar28 = auVar56._4_4_;
      iVar70 = auVar56._8_4_;
      iVar72 = auVar56._12_4_;
      auVar67._0_4_ = auVar56._0_4_ * 4 + (auVar43._0_4_ >> 4);
      auVar67._4_4_ = iVar28 * 4 + (uVar73 >> 4);
      auVar67._8_4_ = iVar70 * 4 + (uVar74 >> 4);
      auVar67._12_4_ = iVar72 * 4 + (uVar75 >> 4);
      auVar48 = packusdw(auVar77 & auVar42,auVar59 & auVar42);
      auVar46 = packusdw(auVar62 & auVar42,auVar67 & auVar42);
      sVar2 = auVar48._0_2_;
      sVar3 = auVar48._2_2_;
      sVar4 = auVar48._4_2_;
      sVar5 = auVar48._6_2_;
      sVar6 = auVar48._8_2_;
      sVar7 = auVar48._10_2_;
      sVar8 = auVar48._12_2_;
      sVar9 = auVar48._14_2_;
      sVar10 = auVar46._0_2_;
      sVar11 = auVar46._2_2_;
      sVar12 = auVar46._4_2_;
      sVar13 = auVar46._6_2_;
      sVar14 = auVar46._8_2_;
      sVar15 = auVar46._10_2_;
      sVar16 = auVar46._12_2_;
      sVar17 = auVar46._14_2_;
      local_78[lVar19] = (0 < sVar2) * (sVar2 < 0x100) * auVar48[0] - (0xff < sVar2);
      local_78[lVar19 + 1] = (0 < sVar3) * (sVar3 < 0x100) * auVar48[2] - (0xff < sVar3);
      local_78[lVar19 + 2] = (0 < sVar4) * (sVar4 < 0x100) * auVar48[4] - (0xff < sVar4);
      local_78[lVar19 + 3] = (0 < sVar5) * (sVar5 < 0x100) * auVar48[6] - (0xff < sVar5);
      local_78[lVar19 + 4] = (0 < sVar6) * (sVar6 < 0x100) * auVar48[8] - (0xff < sVar6);
      local_78[lVar19 + 5] = (0 < sVar7) * (sVar7 < 0x100) * auVar48[10] - (0xff < sVar7);
      local_78[lVar19 + 6] = (0 < sVar8) * (sVar8 < 0x100) * auVar48[0xc] - (0xff < sVar8);
      local_78[lVar19 + 7] = (0 < sVar9) * (sVar9 < 0x100) * auVar48[0xe] - (0xff < sVar9);
      local_78[lVar19 + 8] = (0 < sVar10) * (sVar10 < 0x100) * auVar46[0] - (0xff < sVar10);
      local_78[lVar19 + 9] = (0 < sVar11) * (sVar11 < 0x100) * auVar46[2] - (0xff < sVar11);
      local_78[lVar19 + 10] = (0 < sVar12) * (sVar12 < 0x100) * auVar46[4] - (0xff < sVar12);
      local_78[lVar19 + 0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar46[6] - (0xff < sVar13);
      local_78[lVar19 + 0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar46[8] - (0xff < sVar14);
      local_78[lVar19 + 0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar46[10] - (0xff < sVar15);
      local_78[lVar19 + 0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar46[0xc] - (0xff < sVar16);
      local_78[lVar19 + 0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar46[0xe] - (0xff < sVar17);
      lVar19 = lVar19 + 0x10;
      iVar84 = auVar44._0_4_;
      auVar49._0_4_ = auVar49._0_4_ + iVar84;
      iVar88 = auVar44._4_4_;
      auVar49._4_4_ = uVar27 + iVar88;
      iVar89 = auVar44._8_4_;
      auVar49._8_4_ = uVar41 + iVar89;
      iVar90 = auVar44._12_4_;
      auVar49._12_4_ = uVar39 + iVar90;
      auVar47._0_4_ = auVar47._0_4_ + iVar84;
      auVar47._4_4_ = uVar63 + iVar88;
      auVar47._8_4_ = uVar64 + iVar89;
      auVar47._12_4_ = uVar65 + iVar90;
      auVar45._0_4_ = auVar45._0_4_ + iVar84;
      auVar45._4_4_ = uVar68 + iVar88;
      auVar45._8_4_ = uVar69 + iVar89;
      auVar45._12_4_ = uVar71 + iVar90;
      auVar43._0_4_ = auVar43._0_4_ + iVar84;
      auVar43._4_4_ = uVar73 + iVar88;
      auVar43._8_4_ = uVar74 + iVar89;
      auVar43._12_4_ = uVar75 + iVar90;
      auVar50._0_4_ = auVar50._0_4_ + iVar84;
      auVar50._4_4_ = iVar78 + iVar88;
      auVar50._8_4_ = iVar79 + iVar89;
      auVar50._12_4_ = iVar80 + iVar90;
      auVar52._0_4_ = auVar52._0_4_ + iVar84;
      auVar52._4_4_ = iVar24 + iVar88;
      auVar52._8_4_ = iVar31 + iVar89;
      auVar52._12_4_ = iVar35 + iVar90;
      auVar54._0_4_ = auVar54._0_4_ + iVar84;
      auVar54._4_4_ = iVar26 + iVar88;
      auVar54._8_4_ = iVar36 + iVar89;
      auVar54._12_4_ = iVar33 + iVar90;
      auVar56._0_4_ = auVar56._0_4_ + iVar84;
      auVar56._4_4_ = iVar28 + iVar88;
      auVar56._8_4_ = iVar70 + iVar89;
      auVar56._12_4_ = iVar72 + iVar90;
    } while (lVar19 != 0x40);
    prepare_bc1_single_color_table((bc1_match_entry *)&g_bc1_match6_equals_1,local_78,0x40,0x40,1);
    lVar19 = 0;
    do {
      iVar24 = 0x100;
      lVar25 = 0;
      do {
        iVar35 = (uint)local_78[lVar25] - (int)lVar19;
        iVar31 = -iVar35;
        if (0 < iVar35) {
          iVar31 = iVar35;
        }
        if (iVar31 < iVar24) {
          (&g_bc1_match6_equals_0)[lVar19 * 2] = (char)lVar25;
          (&DAT_0035ef21)[lVar19 * 2] = 0;
          iVar24 = iVar31;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x40);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    lVar19 = 0;
    do {
      *(int *)(g_etc1_to_dxt1_selector_range_index +
              (ulong)(uint)(&DAT_0029dbd4)[lVar19 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar19 * 2] * 0x10) = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    puVar21 = &g_etc1s_to_atc_selector_mappings;
    lVar19 = 0;
    do {
      lVar25 = 0;
      do {
        bVar23 = ""[(byte)puVar21[lVar25]];
        abStack_9c[lVar25] = bVar23;
        abStack_a0[lVar25] = "\x01"[bVar23];
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      lVar25 = 0;
      do {
        iVar24 = 0;
        uVar27 = 0;
        uVar41 = 0;
        do {
          bVar23 = (byte)iVar24;
          uVar39 = (uint)lVar25 >> (bVar23 & 0x1f) & 3;
          uVar41 = uVar41 | (uint)abStack_9c[uVar39] << (bVar23 & 0x1f);
          uVar27 = uVar27 | (uint)abStack_a0[uVar39] << (bVar23 & 0x1f);
          iVar24 = iVar24 + 2;
        } while (iVar24 != 8);
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_256)[lVar25 + lVar19 * 0x100] = (char)uVar41;
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256)[lVar25 + lVar19 * 0x100] = (char)uVar27
        ;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x100);
      lVar19 = lVar19 + 1;
      puVar21 = puVar21 + 4;
    } while (lVar19 != 10);
    lVar19 = 0;
    do {
      *(int *)(g_etc1_to_bc7_m5_selector_range_index +
              (ulong)(uint)(&DAT_0029dbd4)[lVar19 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar19 * 2] * 0x10) = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    lVar19 = 0;
    do {
      *(int *)(g_etc1_to_bc7_m5a_selector_range_index +
              (ulong)(uint)(&DAT_0029dbd4)[lVar19 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar19 * 2] * 0x10) = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match45_equals_1,0x10,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match55_equals_1,0x20,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match56_equals_1,0x20,0x40,1);
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match4,1,0x10,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match5,1,0x20,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match6,1,0x40,3);
    lVar19 = 0;
    do {
      *(int *)(g_etc1s_to_atc_selector_range_index +
              (ulong)(uint)(&DAT_0029dbd4)[lVar19 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar19 * 2] * 0x10) = (int)lVar19;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    lVar19 = 0;
    do {
      iVar24 = 0x7fffffff;
      uVar27 = 0x33;
      iVar35 = 0;
      iVar31 = 0;
      iVar26 = 0;
      do {
        iVar36 = 0;
        uVar41 = uVar27;
        do {
          iVar28 = (int)lVar19 - (uVar41 >> 3);
          iVar33 = -iVar28;
          if (0 < iVar28) {
            iVar33 = iVar28;
          }
          if (iVar33 < iVar24) {
            iVar35 = iVar26;
            iVar24 = iVar33;
            iVar31 = iVar36;
          }
          iVar36 = iVar36 + 1;
          uVar41 = uVar41 + 0x66;
        } while (iVar36 != 8);
        iVar26 = iVar26 + 1;
        uVar27 = uVar27 + 0xaa;
      } while (iVar26 != 8);
      (&g_pvrtc2_alpha_match33)[lVar19 * 2] = (char)iVar35;
      (&DAT_00365821)[lVar19 * 2] = (char)iVar31;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    uVar22 = 0;
    do {
      iVar31 = 0x7fffffff;
      uVar40 = uVar22 & 0xffffffff;
      iVar35 = 0;
      iVar26 = 0;
      iVar24 = 0;
      do {
        iVar33 = (int)uVar40;
        iVar36 = -iVar33;
        if (0 < iVar33) {
          iVar36 = iVar33;
        }
        if (iVar36 < iVar31) {
          iVar24 = iVar26;
          iVar31 = iVar36;
          iVar35 = iVar26;
        }
        iVar26 = iVar26 + 1;
        uVar40 = (ulong)(iVar33 - 0x22);
      } while (iVar26 != 8);
      (&g_pvrtc2_alpha_match33_0)[uVar22 * 2] = (char)iVar35;
      (&DAT_00365a21)[uVar22 * 2] = (char)iVar24;
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0x100);
    iVar24 = -0x11;
    lVar19 = 0;
    do {
      iVar36 = 0x7fffffff;
      iVar33 = 0;
      iVar26 = 0;
      iVar35 = 0;
      iVar31 = iVar24;
      do {
        iVar28 = -iVar31;
        if (0 < iVar31) {
          iVar28 = iVar31;
        }
        if (iVar28 < iVar36) {
          iVar36 = iVar28;
          iVar26 = iVar33;
          iVar35 = iVar33;
        }
        iVar33 = iVar33 + 1;
        iVar31 = iVar31 + -0x22;
      } while (iVar33 != 8);
      (&g_pvrtc2_alpha_match33_3)[lVar19 * 2] = (char)iVar35;
      (&DAT_00365c21)[lVar19 * 2] = (char)iVar26;
      lVar19 = lVar19 + 1;
      iVar24 = iVar24 + 1;
    } while (lVar19 != 0x100);
    lVar19 = 0;
    do {
      iVar24 = 0x7fffffff;
      uVar41 = 0;
      uVar22 = 0;
      uVar27 = 0;
      do {
        iVar31 = 0;
        uVar40 = 0;
        do {
          iVar26 = (int)lVar19 -
                   ((((uint)uVar40 & 0xfffffff8) + (int)(uVar40 >> 1) + iVar31) * 3 +
                    (uVar41 * 0x21 + (uVar41 & 6) * 4) * 5 >> 3);
          iVar35 = -iVar26;
          if (0 < iVar26) {
            iVar35 = iVar26;
          }
          uVar39 = uVar41;
          uVar18 = uVar40;
          if (iVar24 <= iVar35) {
            iVar35 = iVar24;
            uVar39 = uVar27;
            uVar18 = uVar22;
          }
          uVar22 = uVar18;
          uVar27 = uVar39;
          iVar24 = iVar35;
          uVar39 = (uint)uVar40 + 1;
          uVar40 = (ulong)uVar39;
          iVar31 = iVar31 + 0x10;
        } while (uVar39 != 0x10);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 8);
      (&g_pvrtc2_trans_match34)[lVar19 * 2] = (char)uVar27;
      (&DAT_00365e21)[lVar19 * 2] = (char)uVar22;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    lVar19 = 0;
    do {
      iVar24 = 0x7fffffff;
      uVar41 = 0;
      uVar22 = 0;
      uVar27 = 0;
      do {
        iVar31 = 0;
        uVar40 = 0;
        do {
          iVar26 = (int)lVar19 -
                   ((((uint)uVar40 & 0xfffffff8) + (int)(uVar40 >> 1) + iVar31) * 3 +
                    ((uVar41 >> 1) + (uVar41 & 8 | uVar41 << 4)) * 5 >> 3);
          iVar35 = -iVar26;
          if (0 < iVar26) {
            iVar35 = iVar26;
          }
          uVar39 = uVar41;
          uVar18 = uVar40;
          if (iVar24 <= iVar35) {
            iVar35 = iVar24;
            uVar39 = uVar27;
            uVar18 = uVar22;
          }
          uVar22 = uVar18;
          uVar27 = uVar39;
          iVar24 = iVar35;
          uVar39 = (uint)uVar40 + 1;
          uVar40 = (ulong)uVar39;
          iVar31 = iVar31 + 0x10;
        } while (uVar39 != 0x10);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 0x10);
      (&g_pvrtc2_trans_match44)[lVar19 * 2] = (char)uVar27;
      (&DAT_00366021)[lVar19 * 2] = (char)uVar22;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    g_transcoder_initialized = '\x01';
  }
  return;
}

Assistant:

void basisu_transcoder_init()
	{
		if (g_transcoder_initialized)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Called more than once\n");      
			return;
      }
         
     BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Initializing (this is not an error)\n");      

#if BASISD_SUPPORT_UASTC
		uastc_init();
#endif

#if BASISD_SUPPORT_ASTC
		transcoder_init_astc();
#endif
				
#if BASISD_WRITE_NEW_ASTC_TABLES
		create_etc1_to_astc_conversion_table_0_47();
		create_etc1_to_astc_conversion_table_0_255();
		exit(0);
#endif

#if BASISD_WRITE_NEW_BC7_MODE5_TABLES
		create_etc1_to_bc7_m5_color_conversion_table();
		create_etc1_to_bc7_m5_alpha_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_DXT1_TABLES
		create_etc1_to_dxt1_5_conversion_table();
		create_etc1_to_dxt1_6_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_A8_TABLES
		create_etc2_eac_a8_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ATC_TABLES
		create_etc1s_to_atc_conversion_tables();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_R11_TABLES
		create_etc2_eac_r11_conversion_table();
		exit(0);
#endif

#if BASISD_SUPPORT_DXT1 || BASISD_SUPPORT_UASTC
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, 32, 1);
		prepare_bc1_single_color_table(g_bc1_match5_equals_0, bc1_expand5, 1, 32, 0);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, 64, 1);
		prepare_bc1_single_color_table(g_bc1_match6_equals_0, bc1_expand6, 1, 64, 0);

#if 0
		for (uint32_t i = 0; i < 256; i++)
		{
			printf("%u %u %u\n", i, (i * 63 + 127) / 255, g_bc1_match6_equals_0[i].m_hi);
		}
		exit(0);
#endif

#endif

#if BASISD_SUPPORT_DXT1
		for (uint32_t i = 0; i < NUM_ETC1_TO_DXT1_SELECTOR_RANGES; i++)
		{
			uint32_t l = g_etc1_to_dxt1_selector_ranges[i].m_low;
			uint32_t h = g_etc1_to_dxt1_selector_ranges[i].m_high;
			g_etc1_to_dxt1_selector_range_index[l][h] = i;
		}

		for (uint32_t sm = 0; sm < NUM_ETC1_TO_DXT1_SELECTOR_MAPPINGS; sm++)
		{
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1[4];
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv[4];

			for (uint32_t j = 0; j < 4; j++)
			{
				static const uint8_t s_linear_dxt1_to_dxt1[4] = { 0, 2, 3, 1 };
				static const uint8_t s_dxt1_inverted_xlat[4] = { 1, 0, 3, 2 };

				etc1_to_dxt1_selector_mappings_raw_dxt1[j] = (uint8_t)s_linear_dxt1_to_dxt1[g_etc1_to_dxt1_selector_mappings[sm][j]];
				etc1_to_dxt1_selector_mappings_raw_dxt1_inv[j] = (uint8_t)s_dxt1_inverted_xlat[etc1_to_dxt1_selector_mappings_raw_dxt1[j]];
			}

			for (uint32_t i = 0; i < 256; i++)
			{
				uint32_t k = 0, k_inv = 0;
				for (uint32_t s = 0; s < 4; s++)
				{
					k |= (etc1_to_dxt1_selector_mappings_raw_dxt1[(i >> (s * 2)) & 3] << (s * 2));
					k_inv |= (etc1_to_dxt1_selector_mappings_raw_dxt1_inv[(i >> (s * 2)) & 3] << (s * 2));
				}
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_256[sm][i] = (uint8_t)k;
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256[sm][i] = (uint8_t)k_inv;
			}
		}
#endif

#if BASISD_SUPPORT_BC7_MODE5
		transcoder_init_bc7_mode5();
#endif

#if BASISD_SUPPORT_ATC
		transcoder_init_atc();
#endif

#if BASISD_SUPPORT_PVRTC2
		transcoder_init_pvrtc2();
#endif

		g_transcoder_initialized = true;
	}